

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::QueryCase::verifyState
          (QueryCase *this,CallLogWrapper *gl,BoundingBox *bbox)

{
  float fVar1;
  uchar uVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  GLenum GVar7;
  float (*pafVar8) [8];
  int (*paiVar9) [8];
  long (*palVar10) [8];
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  float *pfVar13;
  long lVar14;
  uchar (*pauVar15) [8];
  Enum<int,_1UL> EVar16;
  char *local_fc8;
  int local_fbc;
  undefined1 local_fb8 [4];
  int ndx_6;
  MessageBuilder builder_2;
  int ndx_5;
  Enum<int,_1UL> local_e20;
  GetNameFunc local_e10;
  int local_e08;
  Enum<int,_1UL> local_e00;
  GetNameFunc local_df0;
  int local_de8;
  Enum<int,_1UL> local_de0;
  GetNameFunc local_dd0;
  int local_dc8;
  Enum<int,_1UL> local_dc0;
  GetNameFunc local_db0;
  int local_da8;
  Enum<int,_1UL> local_da0;
  GetNameFunc local_d90;
  int local_d88;
  Enum<int,_1UL> local_d80;
  GetNameFunc local_d70;
  int local_d68;
  Enum<int,_1UL> local_d60;
  GetNameFunc local_d50;
  int local_d48;
  Enum<int,_1UL> local_d40;
  MessageBuilder local_d30;
  byte local_ba9;
  undefined1 local_ba8 [7];
  bool error_3;
  StateQueryMemoryWriteGuard<unsigned_char[8]> state_3;
  GLint64 roundUp_1;
  GLint64 roundDown_1;
  undefined1 local_b78 [4];
  int ndx_4;
  MessageBuilder builder_1;
  long (*palStack_9f0) [8];
  int ndx_3;
  long (*local_9e8) [8];
  Array<long_*> local_9e0;
  MessageBuilder local_9d0;
  byte local_849;
  undefined1 local_848 [7];
  bool error_2;
  StateQueryMemoryWriteGuard<long[8]> state_2;
  int local_780;
  GLint roundUp;
  GLint roundDown;
  int ndx_2;
  MessageBuilder builder;
  int (*paiStack_5f0) [8];
  int ndx_1;
  int (*local_5e8) [8];
  Array<int_*> local_5e0;
  MessageBuilder local_5d0;
  byte local_449;
  undefined1 local_448 [7];
  bool error_1;
  StateQueryMemoryWriteGuard<int[8]> state_1;
  float local_3e0;
  float local_3dc;
  float local_3d8;
  float local_3d4;
  float local_3d0;
  float local_3cc;
  MessageBuilder local_3c8;
  int local_244;
  float (*pafStack_240) [8];
  int ndx;
  float (*local_238) [8];
  Array<float_*> local_230 [2];
  MessageBuilder local_210;
  byte local_89;
  undefined1 local_88 [7];
  bool error;
  StateQueryMemoryWriteGuard<float[8]> state;
  BoundingBox *bbox_local;
  CallLogWrapper *gl_local;
  QueryCase *this_local;
  
  state.m_postguard._24_8_ = bbox;
  switch(this->m_method) {
  case QUERY_FLOAT:
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<float[8]> *)local_88);
    local_89 = 0;
    pafVar8 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_88);
    glu::CallLogWrapper::glGetFloatv(gl,0x92be,*pafVar8);
    GVar7 = glu::CallLogWrapper::glGetError(gl);
    glu::checkError(GVar7,"query",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x138);
    bVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<float[8]> *)local_88,
                       (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (bVar5) {
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_210,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_210,(char (*) [22])"glGetFloatv returned ");
      local_238 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_88);
      pafStack_240 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                     operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_88);
      pafStack_240 = pafStack_240 + 1;
      local_230[0] = tcu::formatArray<float*>
                               ((float **)&local_238,(float **)&stack0xfffffffffffffdc0);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_230);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_210);
      for (local_244 = 0; local_244 < 8; local_244 = local_244 + 1) {
        pafVar8 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_88);
        fVar1 = (*pafVar8)[local_244];
        pfVar13 = BoundingBox::getComponentAccess((BoundingBox *)state.m_postguard._24_8_,local_244)
        ;
        if ((fVar1 != *pfVar13) || (NAN(fVar1) || NAN(*pfVar13))) {
          local_89 = 1;
        }
      }
      if ((local_89 & 1) == 0) {
        this_local._7_1_ = true;
      }
      else {
        pTVar11 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_3c8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<
                            (&local_3c8,(char (*) [25])"Error, unexpected value\n");
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [11])0x2c3fea3);
        local_3cc = tcu::Vector<float,_4>::x((Vector<float,_4> *)state.m_postguard._24_8_);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_3cc);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
        local_3d0 = tcu::Vector<float,_4>::y((Vector<float,_4> *)state.m_postguard._24_8_);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_3d0);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
        local_3d4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)state.m_postguard._24_8_);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_3d4);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
        local_3d8 = tcu::Vector<float,_4>::w((Vector<float,_4> *)state.m_postguard._24_8_);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_3d8);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
        local_3dc = tcu::Vector<float,_4>::x((Vector<float,_4> *)(state.m_postguard._24_8_ + 0x10));
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_3dc);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
        local_3e0 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(state.m_postguard._24_8_ + 0x10));
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_3e0);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
        state_1.m_postguard[7] =
             (int)tcu::Vector<float,_4>::z((Vector<float,_4> *)(state.m_postguard._24_8_ + 0x10));
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(float *)(state_1.m_postguard + 7));
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
        state_1.m_postguard[6] =
             (int)tcu::Vector<float,_4>::w((Vector<float,_4> *)(state.m_postguard._24_8_ + 0x10));
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(float *)(state_1.m_postguard + 6));
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x29ea7ce);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3c8);
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case QUERY_BOOLEAN:
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[8]>::
    StateQueryMemoryWriteGuard((StateQueryMemoryWriteGuard<unsigned_char[8]> *)local_ba8);
    local_ba9 = 0;
    pauVar15 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_ba8);
    glu::CallLogWrapper::glGetBooleanv(gl,0x92be,*pauVar15);
    GVar7 = glu::CallLogWrapper::glGetError(gl);
    glu::checkError(GVar7,"query",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x1bc);
    bVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[8]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_char[8]> *)local_ba8,
                       (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (bVar5) {
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_d30,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_d30,(char (*) [25])"glGetBooleanv returned [");
      pauVar15 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_ba8);
      EVar16 = glu::getBooleanStr((*pauVar15)[0]);
      local_d50 = EVar16.m_getName;
      local_d48 = EVar16.m_value;
      local_d40.m_getName = local_d50;
      local_d40.m_value = local_d48;
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_d40);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
      pauVar15 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_ba8);
      EVar16 = glu::getBooleanStr((*pauVar15)[1]);
      local_d70 = EVar16.m_getName;
      local_d68 = EVar16.m_value;
      local_d60.m_getName = local_d70;
      local_d60.m_value = local_d68;
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_d60);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
      pauVar15 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_ba8);
      EVar16 = glu::getBooleanStr((*pauVar15)[2]);
      local_d90 = EVar16.m_getName;
      local_d88 = EVar16.m_value;
      local_d80.m_getName = local_d90;
      local_d80.m_value = local_d88;
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_d80);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
      pauVar15 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_ba8);
      EVar16 = glu::getBooleanStr((*pauVar15)[3]);
      local_db0 = EVar16.m_getName;
      local_da8 = EVar16.m_value;
      local_da0.m_getName = local_db0;
      local_da0.m_value = local_da8;
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_da0);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
      pauVar15 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_ba8);
      EVar16 = glu::getBooleanStr((*pauVar15)[4]);
      local_dd0 = EVar16.m_getName;
      local_dc8 = EVar16.m_value;
      local_dc0.m_getName = local_dd0;
      local_dc0.m_value = local_dc8;
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_dc0);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
      pauVar15 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_ba8);
      EVar16 = glu::getBooleanStr((*pauVar15)[5]);
      local_df0 = EVar16.m_getName;
      local_de8 = EVar16.m_value;
      local_de0.m_getName = local_df0;
      local_de0.m_value = local_de8;
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_de0);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
      pauVar15 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_ba8);
      EVar16 = glu::getBooleanStr((*pauVar15)[6]);
      local_e10 = EVar16.m_getName;
      local_e08 = EVar16.m_value;
      local_e00.m_getName = local_e10;
      local_e00.m_value = local_e08;
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_e00);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
      pauVar15 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_ba8);
      EVar16 = glu::getBooleanStr((*pauVar15)[7]);
      local_e20.m_getName = EVar16.m_getName;
      local_e20.m_value = EVar16.m_value;
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_e20);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2b3d307);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_d30);
      for (builder_2.m_str._372_4_ = 0; (int)builder_2.m_str._372_4_ < 8;
          builder_2.m_str._372_4_ = builder_2.m_str._372_4_ + 1) {
        pauVar15 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_ba8);
        uVar2 = (*pauVar15)[(int)builder_2.m_str._372_4_];
        pfVar13 = BoundingBox::getComponentAccess
                            ((BoundingBox *)state.m_postguard._24_8_,builder_2.m_str._372_4_);
        if ((bool)uVar2 != (*pfVar13 != 0.0)) {
          local_ba9 = 1;
        }
      }
      if ((local_ba9 & 1) == 0) {
        this_local._7_1_ = true;
      }
      else {
        pTVar11 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::MessageBuilder::MessageBuilder((MessageBuilder *)local_fb8,pTVar11);
        pMVar12 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_fb8,(char (*) [25])"Error, unexpected value\n")
        ;
        tcu::MessageBuilder::operator<<(pMVar12,(char (*) [11])0x2c3fea3);
        for (local_fbc = 0; local_fbc < 8; local_fbc = local_fbc + 1) {
          if (local_fbc != 0) {
            tcu::MessageBuilder::operator<<((MessageBuilder *)local_fb8,(char (*) [3])0x2a4b1eb);
          }
          pfVar13 = BoundingBox::getComponentAccess
                              ((BoundingBox *)state.m_postguard._24_8_,local_fbc);
          local_fc8 = "mapped_ == GL_FALSE";
          if (*pfVar13 != 0.0) {
            local_fc8 = "mapped_ == GL_TRUE";
          }
          if (NAN(*pfVar13)) {
            local_fc8 = "mapped_ == GL_TRUE";
          }
          local_fc8 = local_fc8 + 0xb;
          tcu::MessageBuilder::operator<<((MessageBuilder *)local_fb8,&local_fc8);
        }
        pMVar12 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_fb8,(char (*) [2])0x29ea7ce);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        this_local._7_1_ = false;
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_fb8);
      }
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case QUERY_INT:
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[8]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int[8]> *)local_448);
    local_449 = 0;
    paiVar9 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_448);
    glu::CallLogWrapper::glGetIntegerv(gl,0x92be,*paiVar9);
    GVar7 = glu::CallLogWrapper::glGetError(gl);
    glu::checkError(GVar7,"query",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x15a);
    bVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[8]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int[8]> *)local_448,
                       (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (bVar5) {
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_5d0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_5d0,(char (*) [24])"glGetIntegerv returned ")
      ;
      local_5e8 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_448);
      paiStack_5f0 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                     operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_448);
      paiStack_5f0 = paiStack_5f0 + 1;
      local_5e0 = tcu::formatArray<int*>((int **)&local_5e8,(int **)&stack0xfffffffffffffa10);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_5e0);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_5d0);
      for (builder.m_str._372_4_ = 0; (int)builder.m_str._372_4_ < 8;
          builder.m_str._372_4_ = builder.m_str._372_4_ + 1) {
        paiVar9 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_448);
        iVar3 = (*paiVar9)[(int)builder.m_str._372_4_];
        pfVar13 = BoundingBox::getComponentAccess
                            ((BoundingBox *)state.m_postguard._24_8_,builder.m_str._372_4_);
        iVar6 = deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<int>(*pfVar13);
        if (iVar3 != iVar6) {
          paiVar9 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_448);
          iVar3 = (*paiVar9)[(int)builder.m_str._372_4_];
          pfVar13 = BoundingBox::getComponentAccess
                              ((BoundingBox *)state.m_postguard._24_8_,builder.m_str._372_4_);
          iVar6 = deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<int>(*pfVar13);
          if (iVar3 != iVar6) {
            local_449 = 1;
          }
        }
      }
      if ((local_449 & 1) == 0) {
        this_local._7_1_ = true;
      }
      else {
        pTVar11 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::MessageBuilder::MessageBuilder((MessageBuilder *)&roundDown,pTVar11);
        pMVar12 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&roundDown,(char (*) [25])"Error, unexpected value\n"
                            );
        tcu::MessageBuilder::operator<<(pMVar12,(char (*) [11])0x2c3fea3);
        for (roundUp = 0; roundUp < 8; roundUp = roundUp + 1) {
          pfVar13 = BoundingBox::getComponentAccess((BoundingBox *)state.m_postguard._24_8_,roundUp)
          ;
          local_780 = deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<int>(*pfVar13)
          ;
          pfVar13 = BoundingBox::getComponentAccess((BoundingBox *)state.m_postguard._24_8_,roundUp)
          ;
          state_2.m_postguard[7]._4_4_ =
               deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<int>(*pfVar13);
          if (roundUp != 0) {
            tcu::MessageBuilder::operator<<((MessageBuilder *)&roundDown,(char (*) [3])0x2a4b1eb);
          }
          if (local_780 == state_2.m_postguard[7]._4_4_) {
            tcu::MessageBuilder::operator<<((MessageBuilder *)&roundDown,&local_780);
          }
          else {
            pMVar12 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)&roundDown,(char (*) [2])0x2b7de74);
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_780);
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
            pMVar12 = tcu::MessageBuilder::operator<<
                                (pMVar12,(int *)((long)state_2.m_postguard + 0x3c));
            tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b7dedb);
          }
        }
        pMVar12 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&roundDown,(char (*) [2])0x29ea7ce);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        this_local._7_1_ = false;
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&roundDown);
      }
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case QUERY_INT64:
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[8]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<long[8]> *)local_848);
    local_849 = 0;
    palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_848);
    glu::CallLogWrapper::glGetInteger64v(gl,0x92be,*palVar10);
    GVar7 = glu::CallLogWrapper::glGetError(gl);
    glu::checkError(GVar7,"query",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x18b);
    bVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[8]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<long[8]> *)local_848,
                       (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (bVar5) {
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_9d0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_9d0,(char (*) [26])"glGetInteger64v returned ");
      local_9e8 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_848);
      palStack_9f0 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                     operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_848);
      palStack_9f0 = palStack_9f0 + 1;
      local_9e0 = tcu::formatArray<long*>((long **)&local_9e8,(long **)&stack0xfffffffffffff610);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_9e0);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_9d0);
      for (builder_1.m_str._372_4_ = 0; (int)builder_1.m_str._372_4_ < 8;
          builder_1.m_str._372_4_ = builder_1.m_str._372_4_ + 1) {
        palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_848);
        lVar4 = (*palVar10)[(int)builder_1.m_str._372_4_];
        pfVar13 = BoundingBox::getComponentAccess
                            ((BoundingBox *)state.m_postguard._24_8_,builder_1.m_str._372_4_);
        lVar14 = deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<long>(*pfVar13);
        if (lVar4 != lVar14) {
          palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                     operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_848);
          lVar4 = (*palVar10)[(int)builder_1.m_str._372_4_];
          pfVar13 = BoundingBox::getComponentAccess
                              ((BoundingBox *)state.m_postguard._24_8_,builder_1.m_str._372_4_);
          lVar14 = deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<long>(*pfVar13);
          if (lVar4 != lVar14) {
            local_849 = 1;
          }
        }
      }
      if ((local_849 & 1) == 0) {
        this_local._7_1_ = true;
      }
      else {
        pTVar11 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::MessageBuilder::MessageBuilder((MessageBuilder *)local_b78,pTVar11);
        pMVar12 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_b78,(char (*) [25])"Error, unexpected value\n")
        ;
        tcu::MessageBuilder::operator<<(pMVar12,(char (*) [11])0x2c3fea3);
        for (roundDown_1._4_4_ = 0; roundDown_1._4_4_ < 8; roundDown_1._4_4_ = roundDown_1._4_4_ + 1
            ) {
          pfVar13 = BoundingBox::getComponentAccess
                              ((BoundingBox *)state.m_postguard._24_8_,roundDown_1._4_4_);
          roundUp_1 = deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<long>
                                (*pfVar13);
          pfVar13 = BoundingBox::getComponentAccess
                              ((BoundingBox *)state.m_postguard._24_8_,roundDown_1._4_4_);
          state_3.m_postguard =
               (uchar  [8])
               deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<long>(*pfVar13);
          if (roundDown_1._4_4_ != 0) {
            tcu::MessageBuilder::operator<<((MessageBuilder *)local_b78,(char (*) [3])0x2a4b1eb);
          }
          if ((uchar  [8])roundUp_1 == state_3.m_postguard) {
            tcu::MessageBuilder::operator<<((MessageBuilder *)local_b78,&roundUp_1);
          }
          else {
            pMVar12 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_b78,(char (*) [2])0x2b7de74);
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&roundUp_1);
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(long *)state_3.m_postguard);
            tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b7dedb);
          }
        }
        pMVar12 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_b78,(char (*) [2])0x29ea7ce);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        this_local._7_1_ = false;
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_b78);
      }
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  default:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool QueryCase::verifyState (glu::CallLogWrapper& gl, const BoundingBox& bbox) const
{
	switch (m_method)
	{
		case QUERY_FLOAT:
		{
			StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLfloat[8]>	state;
			bool														error = false;

			gl.glGetFloatv(GL_PRIMITIVE_BOUNDING_BOX_EXT, state);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "query");

			if (!state.verifyValidity(m_testCtx))
				return false;

			m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "glGetFloatv returned " << tcu::formatArray(&state[0], &state[8])
					<< tcu::TestLog::EndMessage;

			for (int ndx = 0; ndx < 8; ++ndx)
				if (state[ndx] != bbox.getComponentAccess(ndx))
					error = true;

			if (error)
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Error, unexpected value\n"
					<< "Expected ["
					<< bbox.min.x() << ", " << bbox.min.y() << ", " << bbox.min.z() << ", " << bbox.min.w() << ", "
					<< bbox.max.x() << ", " << bbox.max.y() << ", " << bbox.max.z() << ", " << bbox.max.w() << "]"
					<< tcu::TestLog::EndMessage;
				return false;
			}
			return true;
		}

		case QUERY_INT:
		{
			StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint[8]>	state;
			bool														error = false;

			gl.glGetIntegerv(GL_PRIMITIVE_BOUNDING_BOX_EXT, state);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "query");

			if (!state.verifyValidity(m_testCtx))
				return false;

			m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "glGetIntegerv returned " << tcu::formatArray(&state[0], &state[8])
					<< tcu::TestLog::EndMessage;

			for (int ndx = 0; ndx < 8; ++ndx)
				if (state[ndx] != StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<glw::GLint>(bbox.getComponentAccess(ndx)) &&
					state[ndx] != StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<glw::GLint>(bbox.getComponentAccess(ndx)))
					error = true;

			if (error)
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder	<< "Error, unexpected value\n"
						<< "Expected [";

				for (int ndx = 0; ndx < 8; ++ndx)
				{
					const glw::GLint roundDown	= StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<glw::GLint>(bbox.getComponentAccess(ndx));
					const glw::GLint roundUp	= StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<glw::GLint>(bbox.getComponentAccess(ndx));

					if (ndx != 0)
						builder << ", ";

					if (roundDown == roundUp)
						builder << roundDown;
					else
						builder << "{" << roundDown << ", " << roundUp << "}";
				}

				builder	<< "]"
						<< tcu::TestLog::EndMessage;
				return false;
			}
			return true;
		}

		case QUERY_INT64:
		{
			StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint64[8]>	state;
			bool																error = false;

			gl.glGetInteger64v(GL_PRIMITIVE_BOUNDING_BOX_EXT, state);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "query");

			if (!state.verifyValidity(m_testCtx))
				return false;

			m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "glGetInteger64v returned " << tcu::formatArray(&state[0], &state[8])
					<< tcu::TestLog::EndMessage;

			for (int ndx = 0; ndx < 8; ++ndx)
				if (state[ndx] != StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<glw::GLint64>(bbox.getComponentAccess(ndx)) &&
					state[ndx] != StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<glw::GLint64>(bbox.getComponentAccess(ndx)))
					error = true;

			if (error)
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder	<< "Error, unexpected value\n"
						<< "Expected [";

				for (int ndx = 0; ndx < 8; ++ndx)
				{
					const glw::GLint64 roundDown	= StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<glw::GLint64>(bbox.getComponentAccess(ndx));
					const glw::GLint64 roundUp		= StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<glw::GLint64>(bbox.getComponentAccess(ndx));

					if (ndx != 0)
						builder << ", ";

					if (roundDown == roundUp)
						builder << roundDown;
					else
						builder << "{" << roundDown << ", " << roundUp << "}";
				}

				builder	<< "]"
						<< tcu::TestLog::EndMessage;
				return false;
			}
			return true;
		}

		case QUERY_BOOLEAN:
		{
			StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLboolean[8]>	state;
			bool															error = false;

			gl.glGetBooleanv(GL_PRIMITIVE_BOUNDING_BOX_EXT, state);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "query");

			if (!state.verifyValidity(m_testCtx))
				return false;

			m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "glGetBooleanv returned ["
					<< glu::getBooleanStr(state[0]) << ", " << glu::getBooleanStr(state[1]) << ", " << glu::getBooleanStr(state[2]) << ", " << glu::getBooleanStr(state[3]) << ", "
					<< glu::getBooleanStr(state[4]) << ", " << glu::getBooleanStr(state[5]) << ", " << glu::getBooleanStr(state[6]) << ", " << glu::getBooleanStr(state[7]) << "]\n"
					<< tcu::TestLog::EndMessage;

			for (int ndx = 0; ndx < 8; ++ndx)
				if (state[ndx] != ((bbox.getComponentAccess(ndx) != 0.0f) ? (GL_TRUE) : (GL_FALSE)))
					error = true;

			if (error)
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder	<< "Error, unexpected value\n"
						<< "Expected [";

				for (int ndx = 0; ndx < 8; ++ndx)
				{
					if (ndx != 0)
						builder << ", ";

					builder << ((bbox.getComponentAccess(ndx) != 0.0f) ? ("GL_TRUE") : ("GL_FALSE"));
				}

				builder	<< "]"
						<< tcu::TestLog::EndMessage;
				return false;
			}
			return true;
		}

		default:
			DE_ASSERT(false);
			return true;
	}
}